

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibrary::Uninitialize(JavascriptLibrary *this)

{
  Type *pTVar1;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int index;
  
  if (((this->moduleRecordList).ptr !=
       (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (this_00 = (this->moduleRecordList).ptr,
     0 < (this_00->
         super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>).count)
     ) {
    index = 0;
    do {
      pTVar1 = JsUtil::
               List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,index);
      SourceTextModuleRecord::ReleaseParserResources(pTVar1->ptr);
      index = index + 1;
      this_00 = (this->moduleRecordList).ptr;
    } while (index < (this_00->
                     super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                     ).count);
  }
  (this->super_JavascriptLibraryBase).globalObject.ptr = (GlobalObject *)0x0;
  return;
}

Assistant:

void JavascriptLibrary::Uninitialize()
    {
#if DBG
        if (moduleRecordList != nullptr)
        {
            // This should mostly be a no-op except for error cases where we may not have had a chance to cleaup a module record yet.
            // Do this only in debug builds to avoid reporting of a memory leak. In release builds this doesn't matter as we will cleanup anyways.
            for (int index = 0; index < moduleRecordList->Count(); index++)
            {
                moduleRecordList->Item(index)->ReleaseParserResources();
            }
        }
#endif
        this->globalObject = nullptr;
    }